

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O3

void Ver_StreamSkipToChars(Ver_Stream_t *p,char *pCharsToStop)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x160,"void Ver_StreamSkipToChars(Ver_Stream_t *, char *)");
  }
  if (pCharsToStop == (char *)0x0) {
    __assert_fail("pCharsToStop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x161,"void Ver_StreamSkipToChars(Ver_Stream_t *, char *)");
  }
  pcVar2 = p->pBufferCur;
  if (p->pBufferStop < pcVar2) {
    Ver_StreamReload(p);
    pcVar2 = p->pBufferCur;
  }
  pcVar1 = p->pBufferEnd;
  if (pcVar2 < pcVar1) {
    do {
      cVar4 = *pCharsToStop;
      pcVar3 = pCharsToStop + 1;
      while (cVar4 != '\0') {
        if (*pcVar2 == cVar4) {
          p->pBufferCur = pcVar2;
          return;
        }
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      }
      if (*pcVar2 == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar1);
  }
  if (p->pBufferStop == pcVar1) {
    p->fStop = 1;
    return;
  }
  printf("Ver_StreamSkipToSymbol() failed to parse the file \"%s\".\n",p->pFileName);
  return;
}

Assistant:

void Ver_StreamSkipToChars( Ver_Stream_t * p, char * pCharsToStop )
{
    char * pChar, * pTemp;
    assert( !p->fStop );
    assert( pCharsToStop != NULL );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // skip the symbols
    for ( pChar = p->pBufferCur; pChar < p->pBufferEnd; pChar++ )
    {
        // skip symbols as long as they are NOT in the list
        for ( pTemp = pCharsToStop; *pTemp; pTemp++ )
            if ( *pChar == *pTemp )
                break;
        if ( *pTemp == 0 ) // pChar is not found in the list
        {
            // count the lines
            if ( *pChar == '\n' )
                p->nLineCounter++;
            continue;
        }
        // the symbol is found - move position and return
        p->pBufferCur = pChar;
        return;
    }
    // the file is finished or the last part continued 
    // through VER_OFFSET_SIZE chars till the end of the buffer
    if ( p->pBufferStop == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return;
    }
    printf( "Ver_StreamSkipToSymbol() failed to parse the file \"%s\".\n", p->pFileName );
}